

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O0

int __thiscall Centaurus::ATNPath::compare(ATNPath *this,ATNPath *p)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  wstring *pwVar4;
  int local_24;
  int id_cmp;
  int i;
  ATNPath *p_local;
  ATNPath *this_local;
  
  iVar1 = depth(this);
  iVar2 = depth(p);
  if (iVar1 < iVar2) {
    this_local._4_4_ = -1;
  }
  else {
    iVar1 = depth(this);
    iVar2 = depth(p);
    if (iVar2 < iVar1) {
      this_local._4_4_ = 1;
    }
    else {
      for (local_24 = 0; iVar1 = depth(this), local_24 < iVar1; local_24 = local_24 + 1) {
        pvVar3 = std::
                 vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ::operator[](&this->
                               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ,(long)local_24);
        pwVar4 = Identifier::str_abi_cxx11_(&pvVar3->first);
        pvVar3 = std::
                 vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ::operator[](&p->
                               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ,(long)local_24);
        Identifier::str_abi_cxx11_(&pvVar3->first);
        iVar1 = std::__cxx11::wstring::compare((wstring *)pwVar4);
        if (iVar1 != 0) {
          return iVar1;
        }
        pvVar3 = std::
                 vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ::operator[](&this->
                               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ,(long)local_24);
        iVar1 = pvVar3->second;
        pvVar3 = std::
                 vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ::operator[](&p->
                               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ,(long)local_24);
        if (iVar1 < pvVar3->second) {
          return -1;
        }
        pvVar3 = std::
                 vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ::operator[](&this->
                               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ,(long)local_24);
        iVar1 = pvVar3->second;
        pvVar3 = std::
                 vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ::operator[](&p->
                               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ,(long)local_24);
        if (pvVar3->second < iVar1) {
          return 1;
        }
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int compare(const ATNPath& p) const
    {
        if (depth() < p.depth())
        {
            return -1;
        }
        else if (depth() > p.depth())
        {
            return +1;
        }
        else
        {
            for (int i = 0; i < depth(); i++)
            {
                int id_cmp = (*this)[i].first.str().compare(p[i].first.str());

                if (id_cmp != 0) return id_cmp;

                if ((*this)[i].second < p[i].second)
                    return -1;
                else if ((*this)[i].second > p[i].second)
                    return +1;
            }
        }
        return 0;
    }